

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::JapaneseCalendar::handleGetLimit
          (JapaneseCalendar *this,UCalendarDateFields field,ELimitType limitType)

{
  int32_t iVar1;
  int32_t iVar2;
  UErrorCode local_24;
  int32_t eraStartYear;
  UErrorCode status;
  ELimitType limitType_local;
  UCalendarDateFields field_local;
  JapaneseCalendar *this_local;
  
  if (field == UCAL_ERA) {
    if ((limitType == UCAL_LIMIT_MINIMUM) || (limitType == UCAL_LIMIT_GREATEST_MINIMUM)) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = gCurrentEra;
    }
  }
  else {
    eraStartYear = limitType;
    status = field;
    _limitType_local = this;
    if (field == UCAL_YEAR) {
      if (limitType < UCAL_LIMIT_LEAST_MAXIMUM) {
        this_local._4_4_ = 1;
      }
      else if (limitType == UCAL_LIMIT_LEAST_MAXIMUM) {
        this_local._4_4_ = 1;
      }
      else if (limitType - UCAL_LIMIT_MAXIMUM < 2) {
        local_24 = U_ZERO_ERROR;
        iVar1 = EraRules::getStartYear(gJapaneseEraRules,gCurrentEra,&local_24);
        iVar2 = GregorianCalendar::handleGetLimit
                          (&this->super_GregorianCalendar,UCAL_YEAR,UCAL_LIMIT_MAXIMUM);
        this_local._4_4_ = iVar2 - iVar1;
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ =
           GregorianCalendar::handleGetLimit(&this->super_GregorianCalendar,field,limitType);
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t JapaneseCalendar::handleGetLimit(UCalendarDateFields field, ELimitType limitType) const
{
    switch(field) {
    case UCAL_ERA:
        if (limitType == UCAL_LIMIT_MINIMUM || limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
            return 0;
        }
        return gCurrentEra;
    case UCAL_YEAR:
        {
            switch (limitType) {
            case UCAL_LIMIT_MINIMUM:
            case UCAL_LIMIT_GREATEST_MINIMUM:
                return 1;
            case UCAL_LIMIT_LEAST_MAXIMUM:
                return 1;
            case  UCAL_LIMIT_COUNT: //added to avoid warning
            case UCAL_LIMIT_MAXIMUM:
            {
                UErrorCode status = U_ZERO_ERROR;
                int32_t eraStartYear = gJapaneseEraRules->getStartYear(gCurrentEra, status);
                U_ASSERT(U_SUCCESS(status));
                return GregorianCalendar::handleGetLimit(UCAL_YEAR, UCAL_LIMIT_MAXIMUM) - eraStartYear;
            }
            default:
                return 1;    // Error condition, invalid limitType
            }
        }
    default:
        return GregorianCalendar::handleGetLimit(field,limitType);
    }
}